

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,bool removeEnvironmentRPath,
               string *emsg,bool *changed)

{
  pointer pcVar1;
  optional<bool> oVar2;
  string *psVar3;
  _Storage<bool,_true> _Var4;
  anon_class_72_3_ec058f21 adjustCallback;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  string local_58;
  _Any_data local_50;
  code *local_40;
  
  local_98 = local_88;
  pcVar1 = (oldRPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + oldRPath->_M_string_length);
  local_78 = local_68;
  pcVar1 = (newRPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + newRPath->_M_string_length);
  local_58 = (string)removeEnvironmentRPath;
  anon_unknown.dwarf_edb043::MakeEmptyCallback
            ((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
              *)&local_50,newRPath);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  psVar3 = (string *)operator_new(0x48);
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,local_98,local_90 + (long)local_98);
  *(string **)(psVar3 + 0x20) = psVar3 + 0x30;
  std::__cxx11::string::_M_construct<char*>(psVar3 + 0x20,local_78,local_70 + (long)local_78);
  psVar3[0x40] = local_58;
  pcStack_a0 = std::
               _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2987:25)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2987:25)>
             ::_M_manager;
  local_b8._M_unused._0_8_ = (undefined8)psVar3;
  oVar2 = anon_unknown.dwarf_edb043::AdjustRPathELF
                    (file,(EmptyCallback *)&local_50,(AdjustCallback *)&local_b8,emsg,changed);
  _Var4._M_value =
       oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
       _M_payload;
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (((ushort)oVar2.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) == 0) {
    if (changed != (bool *)0x0) {
      *changed = false;
    }
    if (newRPath->_M_string_length == 0) {
      _Var4._M_value = true;
    }
    else if (emsg == (string *)0x0) {
      _Var4._M_value = false;
    }
    else {
      _Var4._M_value = false;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x8bca4a);
    }
  }
  return (bool)(_Var4._M_value & 1);
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                bool removeEnvironmentRPath, std::string* emsg,
                                bool* changed)
{
  if (cm::optional<bool> result = ChangeRPathELF(
        file, oldRPath, newRPath, removeEnvironmentRPath, emsg, changed)) {
    return result.value();
  }
  if (cm::optional<bool> result = ChangeRPathXCOFF(
        file, oldRPath, newRPath, removeEnvironmentRPath, emsg, changed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  if (newRPath.empty()) {
    // The caller wanted no RPATH anyway.
    return true;
  }
  if (emsg) {
    *emsg = "The file format is not recognized.";
  }
  return false;
}